

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O2

void __thiscall QJsonDocument::setObject(QJsonDocument *this,QJsonObject *object)

{
  qint64 __p;
  long in_FS_OFFSET;
  QJsonValue local_50;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d)._M_t.
      super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
      super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl ==
      (QJsonDocumentPrivate *)0x0) {
    std::make_unique<QJsonDocumentPrivate>();
    __p = local_38.n;
    local_38.n = 0;
    std::__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::reset
              ((__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               this,(pointer)__p);
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::~unique_ptr
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               &local_38);
  }
  QJsonValue::QJsonValue(&local_50,object);
  QCborValue::fromJsonValue(&local_38,&local_50);
  QCborValue::operator=
            (&((this->d)._M_t.
               super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
               .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl)->value,&local_38)
  ;
  QCborValue::~QCborValue(&local_38);
  QJsonValue::~QJsonValue(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonDocument::setObject(const QJsonObject &object)
{
    if (!d)
        d = std::make_unique<QJsonDocumentPrivate>();

    d->value = QCborValue::fromJsonValue(object);
}